

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O2

bool __thiscall kws::Generator::GenerateHTML(Generator *this,char *dir,bool showAllErrors)

{
  Parser *pPVar1;
  bool bVar2;
  size_type sVar3;
  char cVar4;
  Status SVar5;
  ostream *poVar6;
  ParserVectorType *pPVar7;
  long lVar8;
  ulong uVar9;
  unsigned_long uVar10;
  string *psVar11;
  uint uVar12;
  Parser *this_00;
  pointer pEVar13;
  pointer ppVar14;
  Parser *pPVar15;
  unsigned_long number;
  char *pcVar16;
  char cVar17;
  pointer pcVar18;
  unsigned_long *puVar19;
  CopyStatus CVar20;
  uint local_334;
  string filename2;
  string filename;
  string errorTag;
  Directory directory;
  string l;
  vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
  errorLines;
  string imagedir;
  ErrorVectorType errors;
  string imageProjectLogo;
  
  kwssys::Directory::Directory(&directory);
  std::__cxx11::string::string((string *)&imageProjectLogo,dir,(allocator *)&imagedir);
  SVar5 = kwssys::Directory::Load(&directory,&imageProjectLogo,(string *)0x0);
  std::__cxx11::string::~string((string *)&imageProjectLogo);
  if (SVar5.Kind_ != Success) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Creating HTML directory: ");
    poVar6 = std::operator<<(poVar6,dir);
    std::endl<char,std::char_traits<char>>(poVar6);
    SVar5 = kwssys::SystemTools::MakeDirectory(dir,(mode_t *)0x0);
    if (SVar5.Kind_ != Success) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Cannot create HTML directory: ");
      poVar6 = std::operator<<(poVar6,dir);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  std::__cxx11::string::string((string *)&imagedir,dir,(allocator *)&imageProjectLogo);
  std::__cxx11::string::append((char *)&imagedir);
  if (((this->m_KWStyleLogo)._M_string_length != 0 || (this->m_ProjectLogo)._M_string_length != 0)
     && (SVar5 = kwssys::SystemTools::MakeDirectory(imagedir._M_dataplus._M_p,(mode_t *)0x0),
        SVar5.Kind_ != Success)) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Cannot create images directory: ");
    poVar6 = std::operator<<(poVar6,imagedir._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  if ((this->m_ProjectLogo)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&imageProjectLogo,(string *)&imagedir);
    std::__cxx11::string::append((char *)&imageProjectLogo);
    std::__cxx11::string::string
              ((string *)&filename2,(this->m_ProjectLogo)._M_dataplus._M_p,(allocator *)&errorTag);
    kwssys::SystemTools::GetFilenameName(&filename,&filename2);
    std::__cxx11::string::append((string *)&imageProjectLogo);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&filename2);
    std::__cxx11::string::string
              ((string *)&filename,(this->m_ProjectLogo)._M_dataplus._M_p,(allocator *)&errorTag);
    std::__cxx11::string::string
              ((string *)&filename2,imageProjectLogo._M_dataplus._M_p,(allocator *)&l);
    CVar20 = kwssys::SystemTools::CopyFileIfDifferent(&filename,&filename2);
    std::__cxx11::string::~string((string *)&filename2);
    std::__cxx11::string::~string((string *)&filename);
    if (CVar20.super_Status.Kind_ != Success) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Cannot copy the project logo file: ");
      poVar6 = std::operator<<(poVar6,(this->m_ProjectLogo)._M_dataplus._M_p);
      poVar6 = std::operator<<(poVar6," into ");
      poVar6 = std::operator<<(poVar6,imageProjectLogo._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::__cxx11::string::~string((string *)&imageProjectLogo);
  }
  if ((this->m_KWStyleLogo)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&imageProjectLogo,(string *)&imagedir);
    std::__cxx11::string::append((char *)&imageProjectLogo);
    std::__cxx11::string::string
              ((string *)&filename2,(this->m_KWStyleLogo)._M_dataplus._M_p,(allocator *)&errorTag);
    kwssys::SystemTools::GetFilenameName(&filename,&filename2);
    std::__cxx11::string::append((string *)&imageProjectLogo);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&filename2);
    std::__cxx11::string::string
              ((string *)&filename,(this->m_KWStyleLogo)._M_dataplus._M_p,(allocator *)&errorTag);
    std::__cxx11::string::string
              ((string *)&filename2,imageProjectLogo._M_dataplus._M_p,(allocator *)&l);
    CVar20 = kwssys::SystemTools::CopyFileIfDifferent(&filename,&filename2);
    std::__cxx11::string::~string((string *)&filename2);
    std::__cxx11::string::~string((string *)&filename);
    if (CVar20.super_Status.Kind_ != Success) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Cannot copy the KWStyle logo file: ");
      poVar6 = std::operator<<(poVar6,(this->m_KWStyleLogo)._M_dataplus._M_p);
      poVar6 = std::operator<<(poVar6," into ");
      poVar6 = std::operator<<(poVar6,imageProjectLogo._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::__cxx11::string::~string((string *)&imageProjectLogo);
  }
  GenerateMatrix(this,dir,showAllErrors);
  GenerateDescription(this,dir);
  std::operator<<((ostream *)&std::cout,"Generating HTML...");
  pPVar7 = this->m_Parsers;
  this_00 = (pPVar7->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>)._M_impl.
            super__Vector_impl_data._M_start;
  while (pPVar1 = (pPVar7->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>)._M_impl.
                  super__Vector_impl_data._M_finish, this_00 != pPVar1) {
    if ((showAllErrors) ||
       ((this_00->m_ErrorList).
        super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this_00->m_ErrorList).
        super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::ofstream::ofstream(&imageProjectLogo);
      std::__cxx11::string::string((string *)&filename,(string *)&this_00->m_Filename);
      sVar3 = filename._M_string_length;
      std::__cxx11::string::~string((string *)&filename);
      if (sVar3 == 0) {
        pPVar15 = this_00 + 1;
        std::ofstream::~ofstream(&imageProjectLogo);
      }
      else {
        std::__cxx11::string::string((string *)&filename,dir,(allocator *)&filename2);
        std::__cxx11::string::append((char *)&filename);
        std::__cxx11::string::string((string *)&filename2,(string *)&this_00->m_Filename);
        lVar8 = std::__cxx11::string::find((char *)&filename2,0x1636f2);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)&errorTag,(ulong)&filename2);
          std::__cxx11::string::operator=((string *)&filename2,(string *)&errorTag);
          std::__cxx11::string::~string((string *)&errorTag);
        }
        lVar8 = std::__cxx11::string::find((char *)&filename2,0x161454);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)&errorTag,(ulong)&filename2);
          std::__cxx11::string::operator=((string *)&filename2,(string *)&errorTag);
          std::__cxx11::string::~string((string *)&errorTag);
        }
        uVar9 = std::__cxx11::string::find_last_of((char *)&filename2,0x155501);
        for (uVar12 = 0; (uVar9 != 0xffffffffffffffff && (uVar12 < this->m_MaxDirectoryDepth));
            uVar12 = uVar12 + 1) {
          std::__cxx11::string::replace((ulong)&filename2,uVar9,(char *)0x1);
          uVar9 = std::__cxx11::string::find_last_of((char *)&filename2,0x155501);
        }
        lVar8 = std::__cxx11::string::find_last_of((char *)&filename2,0x155501);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)&errorTag,(ulong)&filename2);
          std::__cxx11::string::operator=((string *)&filename2,(string *)&errorTag);
          std::__cxx11::string::~string((string *)&errorTag);
        }
        std::__cxx11::string::append((string *)&filename);
        std::__cxx11::string::append((char *)&filename);
        std::ofstream::open((char *)&imageProjectLogo,(_Ios_Openmode)filename._M_dataplus._M_p);
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          poVar6 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
          std::endl<char,std::char_traits<char>>(poVar6);
          pPVar15 = this_00;
        }
        else {
          CreateHeader(this,(ostream *)&imageProjectLogo,filename._M_dataplus._M_p);
          poVar6 = std::operator<<((ostream *)&imageProjectLogo,
                                   "<table width=\"100%\" border=\"0\" height=\"1\">");
          std::endl<char,std::char_traits<char>>(poVar6);
          errorLines.
          super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          errorLines.
          super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          errorLines.
          super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                    (&errors,&this_00->m_ErrorList);
          for (pEVar13 = errors.
                         super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pEVar13 !=
              errors.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl
              .super__Vector_impl_data._M_finish; pEVar13 = pEVar13 + 1) {
            for (pcVar18 = (pointer)pEVar13->line; pcVar18 <= (pointer)pEVar13->line2;
                pcVar18 = pcVar18 + 1) {
              errorTag._M_string_length = 0;
              errorTag.field_2._M_allocated_capacity = 0;
              errorTag.field_2._8_8_ = 0;
              for (ppVar14 = errorLines.
                             super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  errorTag._M_dataplus._M_p = pcVar18,
                  ppVar14 !=
                  errorLines.
                  super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar14 = ppVar14 + 1) {
                if (ppVar14->first == (long)(int)pcVar18) {
                  l._M_dataplus._M_p = (pointer)pEVar13->number;
                  std::vector<long,_std::allocator<long>_>::emplace_back<long>
                            (&ppVar14->second,(long *)&l);
                  goto LAB_0013862d;
                }
              }
              l._M_dataplus._M_p = (pointer)pEVar13->number;
              std::vector<long,_std::allocator<long>_>::emplace_back<long>
                        ((vector<long,_std::allocator<long>_> *)&errorTag._M_string_length,
                         (long *)&l);
              std::
              vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
              ::push_back(&errorLines,(value_type *)&errorTag);
LAB_0013862d:
              std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                        ((_Vector_base<long,_std::allocator<long>_> *)&errorTag._M_string_length);
            }
          }
          uVar10 = Parser::GetNumberOfLines(this_00);
          local_334 = 0;
          bVar2 = false;
          while (uVar9 = (ulong)local_334, uVar9 < uVar10) {
            std::__cxx11::string::string((string *)&errorTag,"",(allocator *)&l);
            local_334 = local_334 + 1;
            ppVar14 = errorLines.
                      super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_00138704:
            if (ppVar14 ==
                errorLines.
                super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              psVar11 = &imageProjectLogo;
              pcVar16 = "<tr>";
            }
            else {
              if (ppVar14->first != (long)(int)local_334) goto code_r0x0013870e;
              number = 0xffffffffffffffff;
              for (puVar19 = (unsigned_long *)
                             (ppVar14->second).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  puVar19 !=
                  (unsigned_long *)
                  (ppVar14->second).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar19 = puVar19 + 1) {
                number = *puVar19;
                if (errorTag._M_string_length == 0) {
                  Parser::GetErrorTag_abi_cxx11_(&l,this_00,number);
                  std::__cxx11::string::append((string *)&errorTag);
                }
                else {
                  std::__cxx11::string::append((char *)&errorTag);
                  Parser::GetErrorTag_abi_cxx11_(&l,this_00,number);
                  std::__cxx11::string::append((string *)&errorTag);
                }
                std::__cxx11::string::~string((string *)&l);
              }
              psVar11 = &imageProjectLogo;
              pcVar16 = "<tr>";
              if (-1 < (long)number) {
                poVar6 = std::operator<<((ostream *)psVar11,"<tr bgcolor=\"");
                psVar11 = (string *)std::operator<<(poVar6,ErrorColor + number * 8);
                pcVar16 = "\">";
              }
            }
            poVar6 = std::operator<<((ostream *)psVar11,pcVar16);
            std::endl<char,std::char_traits<char>>(poVar6);
            poVar6 = std::operator<<((ostream *)&imageProjectLogo,"<td height=\"1\">");
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            poVar6 = std::operator<<(poVar6,"</td>");
            std::endl<char,std::char_traits<char>>(poVar6);
            poVar6 = std::operator<<((ostream *)&imageProjectLogo,"<td height=\"1\">");
            poVar6 = std::operator<<(poVar6,errorTag._M_dataplus._M_p);
            poVar6 = std::operator<<(poVar6,"</td>");
            std::endl<char,std::char_traits<char>>(poVar6);
            Parser::GetLine_abi_cxx11_(&l,this_00,uVar9);
            lVar8 = std::__cxx11::string::find((char *)&errorTag,0x16162c);
            if (lVar8 != -1) {
              uVar12 = 0;
              do {
                if (l._M_dataplus._M_p[uVar12] != '\n') {
                  if (l._M_dataplus._M_p[uVar12] != ' ') break;
                  l._M_dataplus._M_p[uVar12] = '*';
                }
                uVar12 = uVar12 + 1;
              } while( true );
            }
            lVar8 = std::__cxx11::string::find((char *)&errorTag,0x161630);
            if (lVar8 != -1) {
              for (uVar9 = (ulong)(uint)l._M_string_length;
                  (1 < (int)uVar9 && (l._M_dataplus._M_p[uVar9 - 1] == ' ')); uVar9 = uVar9 - 1) {
                l._M_dataplus._M_p[uVar9 - 1] = '*';
              }
            }
            cVar17 = (char)&l;
            uVar9 = std::__cxx11::string::find(cVar17,10);
            if (uVar9 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&l,uVar9,(char *)0x1);
            }
            while (uVar9 = std::__cxx11::string::find((char *)&l,0x162488),
                  uVar9 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&l,uVar9,(char *)0x1);
            }
            while (uVar9 = std::__cxx11::string::find((char *)&l,0x1619b2),
                  uVar9 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&l,uVar9,(char *)0x1);
            }
            while (uVar9 = std::__cxx11::string::find(cVar17,0x20), uVar9 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&l,uVar9,(char *)0x1);
            }
            if (bVar2) {
              std::__cxx11::string::insert((ulong)&l,(char *)0x0);
            }
            pcVar16 = (char *)std::__cxx11::string::find((char *)&l,0x1554fa);
            if (pcVar16 == (char *)0xffffffffffffffff) {
              while (pcVar16 = (char *)std::__cxx11::string::find((char *)&l,0x1554fd),
                    pcVar16 != (char *)0xffffffffffffffff) {
                std::__cxx11::string::insert((ulong)&l,pcVar16);
                bVar2 = true;
              }
              if (bVar2) {
                std::__cxx11::string::insert
                          ((ulong)&l,
                           (char *)CONCAT44(l._M_string_length._4_4_,(uint)l._M_string_length));
              }
              while (lVar8 = std::__cxx11::string::find((char *)&l,0x155500), lVar8 != -1) {
                std::__cxx11::string::insert((ulong)&l,(char *)(lVar8 + 2));
                bVar2 = false;
              }
            }
            else {
              std::__cxx11::string::insert((ulong)&l,pcVar16);
              std::__cxx11::string::append((char *)&l);
            }
            poVar6 = std::operator<<((ostream *)&imageProjectLogo,
                                     "<td height=\"1\"><font face=\"Courier New, Courier, mono\" size=\"2\">"
                                    );
            poVar6 = std::operator<<(poVar6,l._M_dataplus._M_p);
            poVar6 = std::operator<<(poVar6,"</font></td>");
            std::endl<char,std::char_traits<char>>(poVar6);
            poVar6 = std::operator<<((ostream *)&imageProjectLogo,"</tr>");
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__cxx11::string::~string((string *)&l);
            std::__cxx11::string::~string((string *)&errorTag);
          }
          poVar6 = std::operator<<((ostream *)&imageProjectLogo,"</table>");
          std::endl<char,std::char_traits<char>>(poVar6);
          CreateFooter(this,(ostream *)&imageProjectLogo);
          std::ofstream::close();
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector(&errors);
          std::
          vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
          ::~vector(&errorLines);
          pPVar15 = this_00 + 1;
        }
        std::__cxx11::string::~string((string *)&filename2);
        std::__cxx11::string::~string((string *)&filename);
        std::ofstream::~ofstream(&imageProjectLogo);
        if (cVar4 == '\0') goto LAB_00138bba;
      }
    }
    else {
      pPVar15 = this_00 + 1;
    }
    pPVar7 = this->m_Parsers;
    this_00 = pPVar15;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"done");
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_00138bba:
  std::__cxx11::string::~string((string *)&imagedir);
  kwssys::Directory::~Directory(&directory);
  return this_00 == pPVar1;
code_r0x0013870e:
  ppVar14 = ppVar14 + 1;
  goto LAB_00138704;
}

Assistant:

bool Generator::GenerateHTML(const char* dir,bool showAllErrors)
{
  // Check if the directory exists. If not create it
  kwssys::Directory directory;
  if(!directory.Load(dir))
    {
    std::cout << "Creating HTML directory: " << dir << std::endl;
    if(!kwssys::SystemTools::MakeDirectory(dir))
      {
      std::cout << "Cannot create HTML directory: " << dir << std::endl;
      }
    }

  std::string imagedir = dir;
  imagedir += "/images";

  // Copy the m_ProjectLogo and m_KWStyleLogo to the images directory
  if (!m_ProjectLogo.empty() || !m_KWStyleLogo.empty()) {
    if(!kwssys::SystemTools::MakeDirectory(imagedir.c_str()))
      {
      std::cout << "Cannot create images directory: "
                << imagedir.c_str() << std::endl;
      }
  }

  if (!m_ProjectLogo.empty()) {
    std::string imageProjectLogo = imagedir;
    imageProjectLogo += "/";
    imageProjectLogo += kwssys::SystemTools::GetFilenameName(m_ProjectLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_ProjectLogo.c_str(),imageProjectLogo.c_str()))
      {
      std::cout << "Cannot copy the project logo file: "
                << m_ProjectLogo.c_str() << " into "
                << imageProjectLogo.c_str() << std::endl;
      }
  }

  if (!m_KWStyleLogo.empty()) {
    std::string imageKWStyleLogo = imagedir;
    imageKWStyleLogo += "/";
    imageKWStyleLogo += kwssys::SystemTools::GetFilenameName(m_KWStyleLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_KWStyleLogo.c_str(),imageKWStyleLogo.c_str()))
      {
      std::cout << "Cannot copy the KWStyle logo file: "
                << m_KWStyleLogo.c_str() << " into "
                << imageKWStyleLogo.c_str() << std::endl;
      }
  }

  // Generate the matrix representation
  this->GenerateMatrix(dir,showAllErrors);
  this->GenerateDescription(dir);

  std::cout << "Generating HTML...";

  // For each file we generate an html page
  ParserVectorType::const_iterator it = m_Parsers->begin();
  while(it != m_Parsers->end())
    {
    if (!showAllErrors && (*it).GetErrors().empty()) {
      it++;
      continue;
    }

    std::ofstream file;

    if ((*it).GetFilename().empty()) {
      it++;
      continue;
    }

    // Extract the filename
    // Replace '/' by '_'
    std::string filename = dir;
    filename += "/";
    std::string filename2 = (*it).GetFilename();
    if(long int pos = filename2.find(":/") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }
    if(long int pos = filename2.find(":\\") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }

      auto slash = static_cast<long int>(filename2.find_last_of("/"));
      unsigned int i = 0;
      while (slash != -1 && i < m_MaxDirectoryDepth) {
        filename2.replace(slash, 1, "_");
        slash = static_cast<long int>(filename2.find_last_of("/"));
        i++;
      }
    slash = static_cast<long int>(filename2.find_last_of("/"));
    if(slash != -1)
      {
      filename2 = filename2.substr(slash+1,filename2.size()-slash-1);
      }
    filename += filename2;

    filename += ".html";

    file.open(filename.c_str(), std::ios::binary | std::ios::out);
    if(!file.is_open())
      {
      std::cout << "Cannot open file for writing: " <<  std::endl;
      return false;
      }

    this->CreateHeader(&file,filename.c_str());

    file << R"(<table width="100%" border="0" height="1">)" << std::endl;

    // To speedup the process we list the lines that have errors
    using ErrorLineType = std::pair<long, std::vector<long>>;
    std::vector<ErrorLineType> errorLines;

    const Parser::ErrorVectorType errors = (*it).GetErrors();
    auto itError = errors.begin();
    while (itError != errors.end()) {
      for (unsigned long index = (*itError).line; index <= (*itError).line2;
           index++) {
        ErrorLineType errLine;
        errLine.first = index;

        // Check if the line already exists
        auto errorLineIt = errorLines.begin();
        while (errorLineIt != errorLines.end()) {
          if ((*errorLineIt).first == static_cast<int>(index)) {
            break;
          }
          errorLineIt++;
        }

        if (errorLineIt != errorLines.end()) {
          (*errorLineIt).second.push_back((*itError).number);
        } else {
          errLine.second.push_back((*itError).number);
          errorLines.push_back(errLine);
        }
      }
      itError++;
     }

    bool comment = false;
    unsigned long nLines = (*it).GetNumberOfLines();
    for(i=0;i<nLines;i++)
      {
      // Look in the errors if there is a match for this line
      long error = -1;
      std::string errorTag = "";

      std::vector<ErrorLineType>::const_iterator errorLineIt = errorLines.begin();
      while(errorLineIt != errorLines.end())
        {
        if((*errorLineIt).first == static_cast<int>(i+1))
          {
          auto err = (*errorLineIt).second.begin();
          while(err != (*errorLineIt).second.end())
            {
            error = *err;
            if (errorTag.empty()) {
              errorTag += (*it).GetErrorTag(error);
            } else {
              errorTag += ",";
              errorTag += (*it).GetErrorTag(error);
            }
             err++;
             }
           break;
           }
         errorLineIt++;
         }

      if(error>=0)
        {
        file << "<tr bgcolor=\"" << ErrorColor[error]  << "\">" << std::endl;
        }
      else
        {
        file << "<tr>" << std::endl;
        }

      // First column is the line number
      file << "<td height=\"1\">" << i+1 << "</td>" << std::endl;

      // Second column is the error tag
      file << "<td height=\"1\">" << errorTag.c_str() << "</td>" << std::endl;

      std::string l = (*it).GetLine(i);

      // If the error is of type INDENT we show the problem as *
      if(errorTag.find("IND") != std::string::npos)
        {
        unsigned int k = 0;
        while((l[k] == ' ') || (l[k] == '\n'))
          {
          if(l[k] == ' ')
            {
            l[k]='*';
            }
          k++;
          }
        }

      // If the error is of type extra spaces we show the problem as *
      if(errorTag.find("ESP") != std::string::npos)
        {
        int k = static_cast<int>(l.size())-1;
        while(k>0 && (l[k] == ' '))
          {
          l[k]='*';
          k--;
          }
        }

      // Remove the first \n
        auto p = static_cast<long int>(l.find('\n'));
        if (p != -1) {
          l.replace(p, 1, "");
        }

      // Replace < and >
        auto inf = static_cast<long int>(l.find("<", 0));
        while (inf != -1) {
          l.replace(inf, 1, "&lt;");
          inf = static_cast<long int>(l.find("<", 0));
        }

        auto sup = static_cast<long int>(l.find(">", 0));
        while (sup != -1) {
          l.replace(sup, 1, "&gt;");
          sup = static_cast<long int>(l.find(">", 0));
        }

      // Replace the space by &nbsp;
        auto space = static_cast<long int>(l.find(' ', 0));
        while (space != -1) {
          l.replace(space, 1, "&nbsp;");
          space = static_cast<long int>(l.find(' ', space + 1));
        }

      // Show the comments in green
      if(comment)
        {
        l.insert(0,"<font color=\"#009933\">");
        }

      // Show the comments in green
      space = static_cast<long int>(l.find("//",0));
      if(space != -1)
        {
        l.insert(space,"<font color=\"#009933\">");
        l += "<font>";
        }
      else
        {
        space = static_cast<long int>(l.find("/*",0));
        while(space != -1)
          {
          comment = true;
          l.insert(space,"<font color=\"#009933\">");
          space = static_cast<long int>(l.find("/*",space+23));
          }

        if(comment)
          {
          l.insert(l.size(),"</font>");
          }

        space = static_cast<long int>(l.find("*/",0));

        while(space != -1)
          {
          comment = false;
          l.insert(space+2,"</font>");
          space = static_cast<long int>(l.find("*/",space+8));
          }
        }
        file
            << R"(<td height="1"><font face="Courier New, Courier, mono" size="2">)"
            << l.c_str() << "</font></td>" << std::endl;
        file << "</tr>" << std::endl;
      }

    file << "</table>" << std::endl;

    this->CreateFooter(&file);

    file.close();
    it++;
    }

  std::cout << "done" << std::endl;
  return true;
}